

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Collision_Elastic_PDU.cpp
# Opt level: O0

void __thiscall
KDIS::PDU::Collision_Elastic_PDU::SetCollisionIntermediateResult
          (Collision_Elastic_PDU *this,KFLOAT32 XX,KFLOAT32 XY,KFLOAT32 XZ,KFLOAT32 YY,KFLOAT32 YZ,
          KFLOAT32 ZZ)

{
  KFLOAT32 ZZ_local;
  KFLOAT32 YZ_local;
  KFLOAT32 YY_local;
  KFLOAT32 XZ_local;
  KFLOAT32 XY_local;
  KFLOAT32 XX_local;
  Collision_Elastic_PDU *this_local;
  
  this->m_f32CIRXX = XX;
  this->m_f32CIRXY = XY;
  this->m_f32CIRXZ = XZ;
  this->m_f32CIRYY = YY;
  this->m_f32CIRYZ = YZ;
  this->m_f32CIRZZ = ZZ;
  return;
}

Assistant:

void Collision_Elastic_PDU::SetCollisionIntermediateResult( KFLOAT32 XX, KFLOAT32 XY, KFLOAT32 XZ,
        KFLOAT32 YY, KFLOAT32 YZ, KFLOAT32 ZZ )
{
    m_f32CIRXX = XX;
    m_f32CIRXY = XY;
    m_f32CIRXZ = XZ;
    m_f32CIRYY = YY;
    m_f32CIRYZ = YZ;
    m_f32CIRZZ = ZZ;
}